

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# csharp_field_base.cc
# Opt level: O3

string * __thiscall
google::protobuf::compiler::csharp::FieldGeneratorBase::capitalized_type_name_abi_cxx11_
          (string *__return_storage_ptr__,FieldGeneratorBase *this)

{
  FieldDescriptor *pFVar1;
  LogMessage *other;
  char *pcVar2;
  char *pcVar3;
  FieldDescriptor *local_50;
  LogMessage local_48;
  
  pFVar1 = this->descriptor_;
  if (*(once_flag **)(pFVar1 + 0x18) != (once_flag *)0x0) {
    local_48._0_8_ = FieldDescriptor::TypeOnceInit;
    local_50 = pFVar1;
    std::
    call_once<void(*)(google::protobuf::FieldDescriptor_const*),google::protobuf::FieldDescriptor_const*>
              (*(once_flag **)(pFVar1 + 0x18),(_func_void_FieldDescriptor_ptr **)&local_48,&local_50
              );
  }
  switch(pFVar1[2]) {
  case (FieldDescriptor)0x1:
    (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
    pcVar3 = "Double";
    pcVar2 = "";
    break;
  case (FieldDescriptor)0x2:
    (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
    pcVar3 = "Float";
    pcVar2 = "";
    break;
  case (FieldDescriptor)0x3:
    (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
    pcVar3 = "Int64";
    pcVar2 = "";
    break;
  case (FieldDescriptor)0x4:
    (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
    pcVar3 = "UInt64";
    pcVar2 = "";
    break;
  case (FieldDescriptor)0x5:
    (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
    pcVar3 = "Int32";
    pcVar2 = "";
    break;
  case (FieldDescriptor)0x6:
    (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
    pcVar3 = "Fixed64";
    pcVar2 = "";
    break;
  case (FieldDescriptor)0x7:
    (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
    pcVar3 = "Fixed32";
    pcVar2 = "";
    break;
  case (FieldDescriptor)0x8:
    (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
    pcVar3 = "Bool";
    pcVar2 = "";
    break;
  case (FieldDescriptor)0x9:
    (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
    pcVar3 = "String";
    pcVar2 = "";
    break;
  case (FieldDescriptor)0xa:
    (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
    pcVar3 = "Group";
    pcVar2 = "";
    break;
  case (FieldDescriptor)0xb:
    (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
    pcVar3 = "Message";
    pcVar2 = "";
    break;
  case (FieldDescriptor)0xc:
    (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
    pcVar3 = "Bytes";
    pcVar2 = "";
    break;
  case (FieldDescriptor)0xd:
    (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
    pcVar3 = "UInt32";
    pcVar2 = "";
    break;
  case (FieldDescriptor)0xe:
    (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
    pcVar3 = "Enum";
    pcVar2 = "";
    break;
  case (FieldDescriptor)0xf:
    (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
    pcVar3 = "SFixed32";
    pcVar2 = "";
    break;
  case (FieldDescriptor)0x10:
    (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
    pcVar3 = "SFixed64";
    pcVar2 = "";
    break;
  case (FieldDescriptor)0x11:
    (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
    pcVar3 = "SInt32";
    pcVar2 = "";
    break;
  case (FieldDescriptor)0x12:
    (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
    pcVar3 = "SInt64";
    pcVar2 = "";
    break;
  default:
    internal::LogMessage::LogMessage
              (&local_48,LOGLEVEL_DFATAL,
               "/workspace/llm4binary/github/license_c_cmakelists/apple[P]coremltools/deps/protobuf/src/google/protobuf/compiler/csharp/csharp_field_base.cc"
               ,0x1c3);
    other = internal::LogMessage::operator<<(&local_48,"Unknown field type.");
    internal::LogFinisher::operator=((LogFinisher *)&local_50,other);
    internal::LogMessage::~LogMessage(&local_48);
    (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
    pcVar2 = "";
    pcVar3 = "";
  }
  std::__cxx11::string::_M_construct<char_const*>((string *)__return_storage_ptr__,pcVar3,pcVar2);
  return __return_storage_ptr__;
}

Assistant:

std::string FieldGeneratorBase::capitalized_type_name() {
  switch (descriptor_->type()) {
    case FieldDescriptor::TYPE_ENUM:
      return "Enum";
    case FieldDescriptor::TYPE_MESSAGE:
      return "Message";
    case FieldDescriptor::TYPE_GROUP:
      return "Group";
    case FieldDescriptor::TYPE_DOUBLE:
      return "Double";
    case FieldDescriptor::TYPE_FLOAT:
      return "Float";
    case FieldDescriptor::TYPE_INT64:
      return "Int64";
    case FieldDescriptor::TYPE_UINT64:
      return "UInt64";
    case FieldDescriptor::TYPE_INT32:
      return "Int32";
    case FieldDescriptor::TYPE_FIXED64:
      return "Fixed64";
    case FieldDescriptor::TYPE_FIXED32:
      return "Fixed32";
    case FieldDescriptor::TYPE_BOOL:
      return "Bool";
    case FieldDescriptor::TYPE_STRING:
      return "String";
    case FieldDescriptor::TYPE_BYTES:
      return "Bytes";
    case FieldDescriptor::TYPE_UINT32:
      return "UInt32";
    case FieldDescriptor::TYPE_SFIXED32:
      return "SFixed32";
    case FieldDescriptor::TYPE_SFIXED64:
      return "SFixed64";
    case FieldDescriptor::TYPE_SINT32:
      return "SInt32";
    case FieldDescriptor::TYPE_SINT64:
      return "SInt64";
    default:
      GOOGLE_LOG(FATAL)<< "Unknown field type.";
      return "";
  }
}